

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexec.c
# Opt level: O1

int regexec(regex_t *__preg,char *__string,size_t __nmatch,regmatch_t *__pmatch,int __eflags)

{
  undefined8 *puVar1;
  char cVar2;
  sopno sVar3;
  size_t sVar4;
  undefined8 uVar5;
  char *bef;
  re_guts *prVar6;
  int iVar7;
  uint st;
  uint bef_00;
  uint uVar8;
  regmatch_t rVar9;
  char *pcVar10;
  ushort **ppuVar11;
  char *pcVar12;
  size_t sVar13;
  regoff_t *prVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  regmatch_t *__ptr;
  undefined8 *puVar18;
  regmatch_t *__ptr_00;
  int iVar19;
  int iVar20;
  int iVar21;
  char *pcVar22;
  char *pcVar23;
  long lVar24;
  long lVar25;
  bool bVar26;
  lmat local_d0;
  re_guts *local_60;
  char *local_58;
  regmatch_t *local_50;
  char *local_48;
  char *local_40;
  size_t local_38;
  
  if (*(int *)&__preg->buffer != 0xf265) {
    return 2;
  }
  local_60 = (re_guts *)__preg->syntax;
  if (local_60->magic != 0xd245) {
    return 2;
  }
  local_50 = __pmatch;
  if ((local_60->iflags & 4) != 0) {
    __assert_fail("!(g->iflags&BAD)",
                  "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regexec.c"
                  ,0x79,"int regexec()");
  }
  local_d0.eflags = __eflags;
  local_d0.offp = __string;
  if ((((uint)__eflags >> 9 & 1) != 0) || (0x20 < (ulong)local_60->nstates)) {
    lVar25 = local_60->firststate;
    sVar3 = local_60->laststate;
    local_38 = 0;
    if ((local_60->cflags & 4) == 0) {
      local_38 = __nmatch;
    }
    if ((__eflags & 4U) == 0) {
      rVar9 = (regmatch_t)strlen(__string);
      pcVar23 = __string;
    }
    else {
      pcVar23 = __string + (long)*__pmatch;
      rVar9 = __pmatch[1];
    }
    pcVar10 = __string + (long)rVar9;
    lVar24 = (long)pcVar10 - (long)pcVar23;
    if (pcVar10 < pcVar23) {
      return 0x10;
    }
    pcVar12 = local_60->must;
    if (pcVar12 != (char *)0x0) {
      pcVar22 = pcVar23;
      if (pcVar23 < pcVar10) {
        cVar2 = *pcVar12;
        do {
          if (((*pcVar22 == cVar2) && (local_60->mlen <= lVar24)) &&
             (iVar7 = bcmp(pcVar22,pcVar12,(long)local_60->mlen), iVar7 == 0)) break;
          pcVar22 = pcVar22 + 1;
          lVar24 = lVar24 + -1;
        } while (pcVar22 < pcVar10);
      }
      if (pcVar22 == pcVar10) {
        return 1;
      }
    }
    local_d0.g = local_60;
    local_d0.pmatch = (regmatch_t *)0x0;
    local_d0.lastpos = (char **)0x0;
    sVar4 = local_60->nstates;
    local_d0.beginp = pcVar23;
    local_d0.endp = pcVar10;
    local_d0.space = (char *)malloc(sVar4 * 4);
    if ((regmatch_t *)local_d0.space == (regmatch_t *)0x0) {
      return 0xc;
    }
    lVar25 = lVar25 + 1;
    local_d0.st._0_4_ = SUB84(local_d0.space,0);
    local_d0.st._4_4_ = (undefined4)((ulong)local_d0.space >> 0x20);
    local_d0.fresh = (char *)((long)&((regmatch_t *)local_d0.space)->rm_so + sVar4);
    local_d0.tmp = (char *)((long)&((regmatch_t *)local_d0.space)->rm_so + sVar4 * 2);
    local_d0.vn = 4;
    local_d0.empty = (char *)((long)&((regmatch_t *)local_d0.space)->rm_so + sVar4 * 3);
    memset(local_d0.empty,0,sVar4);
LAB_00105ed2:
    pcVar22 = local_d0.tmp;
    pcVar12 = local_d0.fresh;
    if (local_d0.beginp == pcVar23) {
      iVar7 = 0x80;
    }
    else {
      iVar7 = (int)pcVar23[-1];
    }
    bef = (char *)CONCAT44(local_d0.st._4_4_,local_d0.st._0_4_);
    memset(bef,0,(local_d0.g)->nstates);
    bef[lVar25] = '\x01';
    lstep(local_d0.g,lVar25,sVar3,bef,0x84,bef);
    memcpy(pcVar12,bef,(local_d0.g)->nstates);
    lprint(&local_d0,"start",bef,(int)*pcVar23,_stdout);
    local_40 = pcVar12;
    pcVar12 = (char *)0x0;
    do {
      prVar6 = local_d0.g;
      local_58 = (char *)CONCAT44(local_58._4_4_,iVar7);
      if (pcVar23 == local_d0.endp) {
        iVar7 = 0x80;
      }
      else {
        iVar7 = (int)*pcVar23;
      }
      iVar19 = bcmp(bef,local_40,(local_d0.g)->nstates);
      local_48 = pcVar12;
      if (iVar19 == 0) {
        local_48 = pcVar23;
      }
      iVar19 = 0;
      iVar17 = 0x82;
      if ((int)local_58 == 0x80) {
        iVar20 = 0;
        if ((local_d0.eflags & 1U) == 0) goto LAB_00106005;
      }
      else if (((int)local_58 == 10) && ((prVar6->cflags & 8) != 0)) {
LAB_00106005:
        iVar20 = prVar6->nbol;
        iVar19 = 0x81;
        iVar17 = 0x83;
      }
      else {
        iVar20 = 0;
      }
      if (iVar7 == 0x80) {
        if ((local_d0.eflags & 2U) == 0) goto LAB_0010603e;
      }
      else if ((iVar7 == 10) && ((prVar6->cflags & 8) != 0)) {
LAB_0010603e:
        iVar20 = iVar20 + prVar6->neol;
        iVar19 = iVar17;
      }
      if (iVar20 != 0) {
        if (0 < iVar20) {
          iVar20 = iVar20 + 1;
          do {
            lstep(local_d0.g,lVar25,sVar3,bef,iVar19,bef);
            iVar20 = iVar20 + -1;
          } while (1 < iVar20);
        }
        lprint(&local_d0,"boleol",bef,iVar7,_stdout);
      }
      iVar17 = (int)local_58;
      if (iVar19 == 0x81) {
        iVar20 = 0x81;
joined_r0x001060fc:
        if (iVar7 != 0x80) {
          ppuVar11 = __ctype_b_loc();
          if (iVar7 == 0x5f) {
            iVar19 = 0x85;
          }
          if (((*ppuVar11)[iVar7] & 8) != 0) {
            iVar19 = 0x85;
          }
          iVar17 = (int)local_58;
          iVar20 = iVar19;
        }
      }
      else {
        iVar20 = iVar19;
        if ((int)local_58 != 0x80) {
          ppuVar11 = __ctype_b_loc();
          iVar17 = (int)local_58;
          if ((((*ppuVar11)[(int)local_58] & 8) == 0) && ((int)local_58 != 0x5f))
          goto joined_r0x001060fc;
        }
      }
      if (iVar17 != 0x80) {
        ppuVar11 = __ctype_b_loc();
        if (((((*ppuVar11)[(int)local_58] & 8) != 0) || ((int)local_58 == 0x5f)) &&
           ((iVar20 == 0x82 ||
            (((iVar7 != 0x80 && (((*ppuVar11)[iVar7] & 8) == 0)) && (iVar7 != 0x5f)))))) {
          iVar20 = 0x86;
        }
      }
      if (iVar20 - 0x85U < 2) {
        lstep(local_d0.g,lVar25,sVar3,bef,iVar20,bef);
        lprint(&local_d0,"boweow",bef,iVar7,_stdout);
      }
      sVar4 = local_38;
      prVar6 = local_60;
      if ((pcVar23 == pcVar10) || (bef[sVar3] != '\0')) goto LAB_001062de;
      memcpy(pcVar22,bef,(local_d0.g)->nstates);
      memcpy(bef,local_40,(local_d0.g)->nstates);
      if (iVar7 == 0x80) {
        pcVar23 = "char *lfast()";
        goto LAB_00106ff6;
      }
      lstep(local_d0.g,lVar25,sVar3,pcVar22,iVar7,bef);
      lprint(&local_d0,"aft",bef,iVar7,_stdout);
      lstep(local_d0.g,lVar25,sVar3,bef,0x84,bef);
      pcVar23 = pcVar23 + 1;
      pcVar12 = local_48;
    } while( true );
  }
  lVar25 = local_60->firststate;
  sVar3 = local_60->laststate;
  uVar16 = 0;
  if ((local_60->cflags & 4) == 0) {
    uVar16 = __nmatch;
  }
  if ((__eflags & 4U) == 0) {
    rVar9 = (regmatch_t)strlen(__string);
    pcVar23 = __string;
  }
  else {
    pcVar23 = __string + (long)*__pmatch;
    rVar9 = __pmatch[1];
  }
  pcVar10 = __string + (long)rVar9;
  lVar24 = (long)pcVar10 - (long)pcVar23;
  if (pcVar10 < pcVar23) {
    return 0x10;
  }
  pcVar12 = local_60->must;
  if (pcVar12 != (char *)0x0) {
    pcVar22 = pcVar23;
    if (pcVar23 < pcVar10) {
      cVar2 = *pcVar12;
      do {
        if ((*pcVar22 == cVar2) && (local_60->mlen <= lVar24)) {
          iVar7 = bcmp(pcVar22,pcVar12,(long)local_60->mlen);
          if (iVar7 == 0) break;
        }
        pcVar22 = pcVar22 + 1;
        lVar24 = lVar24 + -1;
      } while (pcVar22 < pcVar10);
    }
    if (pcVar22 == pcVar10) {
      return 1;
    }
  }
  lVar25 = lVar25 + 1;
  local_d0.g = local_60;
  local_d0.pmatch = (regmatch_t *)0x0;
  local_d0.lastpos = (char **)0x0;
  local_38 = CONCAT44(local_38._4_4_,1 << ((byte)lVar25 & 0x1f));
  local_48 = (char *)CONCAT44(local_48._4_4_,1 << ((byte)sVar3 & 0x1f));
  local_d0._68_4_ = 0;
  local_d0.space = (char *)0x0;
  local_d0.st._0_4_ = 0;
  local_d0.beginp = pcVar23;
  local_d0.endp = pcVar10;
LAB_00106711:
  if (local_d0.beginp == pcVar23) {
    iVar7 = 0x80;
  }
  else {
    iVar7 = (int)pcVar23[-1];
  }
  st = sstep(local_d0.g,lVar25,sVar3,(uint)local_38,0x84,(uint)local_38);
  sprint((smat *)&local_d0,"start",st,(int)*pcVar23,_stdout);
  local_58 = (char *)0x0;
  local_40 = (char *)CONCAT44(local_40._4_4_,st);
  bef_00 = st;
  do {
    if (pcVar23 == local_d0.endp) {
      iVar19 = 0x80;
    }
    else {
      iVar19 = (int)*pcVar23;
    }
    if (bef_00 == st) {
      local_58 = pcVar23;
    }
    iVar17 = 0;
    iVar20 = 0x82;
    if (iVar7 == 0x80) {
      iVar21 = 0;
      iVar17 = 0;
      if ((local_d0.eflags & 1U) == 0) goto LAB_001067d4;
    }
    else if ((iVar7 == 10) && (((local_d0.g)->cflags & 8) != 0)) {
LAB_001067d4:
      iVar21 = (local_d0.g)->nbol;
      iVar17 = 0x81;
      iVar20 = 0x83;
    }
    else {
      iVar21 = 0;
    }
    if (iVar19 == 0x80) {
      if ((local_d0.eflags & 2U) == 0) goto LAB_00106816;
    }
    else if ((iVar19 == 10) && (((local_d0.g)->cflags & 8) != 0)) {
LAB_00106816:
      iVar21 = iVar21 + (local_d0.g)->neol;
      iVar17 = iVar20;
    }
    if (iVar21 != 0) {
      if (0 < iVar21) {
        iVar21 = iVar21 + 1;
        do {
          bef_00 = sstep(local_d0.g,lVar25,sVar3,bef_00,iVar17,bef_00);
          iVar21 = iVar21 + -1;
        } while (1 < iVar21);
      }
      sprint((smat *)&local_d0,"boleol",bef_00,iVar19,_stdout);
    }
    if (iVar17 == 0x81) {
      iVar20 = 0x81;
joined_r0x001068ce:
      if (iVar19 != 0x80) {
        ppuVar11 = __ctype_b_loc();
        if (iVar19 == 0x5f) {
          iVar17 = 0x85;
        }
        iVar20 = iVar17;
        if (((*ppuVar11)[iVar19] & 8) != 0) {
          iVar20 = 0x85;
        }
      }
    }
    else {
      iVar20 = iVar17;
      if (((iVar7 != 0x80) && (ppuVar11 = __ctype_b_loc(), ((*ppuVar11)[iVar7] & 8) == 0)) &&
         (iVar7 != 0x5f)) goto joined_r0x001068ce;
    }
    if (iVar7 != 0x80) {
      ppuVar11 = __ctype_b_loc();
      if (((((*ppuVar11)[iVar7] & 8) != 0) || (iVar7 == 0x5f)) &&
         ((iVar20 == 0x82 ||
          (((iVar19 != 0x80 && (((*ppuVar11)[iVar19] & 8) == 0)) && (iVar19 != 0x5f)))))) {
        iVar20 = 0x86;
      }
    }
    if (iVar20 - 0x85U < 2) {
      bef_00 = sstep(local_d0.g,lVar25,sVar3,bef_00,iVar20,bef_00);
      sprint((smat *)&local_d0,"boweow",bef_00,iVar19,_stdout);
    }
    prVar6 = local_60;
    if ((pcVar23 == pcVar10) || ((bef_00 & (uint)local_48) != 0)) goto LAB_00106a4f;
    if (iVar19 == 0x80) {
      pcVar23 = "char *sfast()";
LAB_00106ff6:
      __assert_fail("c != OUT",
                    "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                    ,0x2c9,pcVar23);
    }
    st = (uint)local_40;
    bef_00 = sstep(local_d0.g,lVar25,sVar3,bef_00,iVar19,(uint)local_40);
    sprint((smat *)&local_d0,"aft",bef_00,iVar19,_stdout);
    uVar8 = sstep(local_d0.g,lVar25,sVar3,bef_00,0x84,bef_00);
    if (uVar8 != bef_00) {
      __assert_fail("EQ(step(m->g, startst, stopst, st, NOTHING, st), st)",
                    "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                    ,0x2cc,"char *sfast()");
    }
    pcVar23 = pcVar23 + 1;
    iVar7 = iVar19;
  } while( true );
LAB_001062de:
  if (local_48 == (char *)0x0) {
    pcVar23 = "char *lfast()";
    goto LAB_001070af;
  }
  local_d0.coldp = local_48;
  if (bef[sVar3] == '\0') {
    iVar7 = 1;
    __ptr_00 = (regmatch_t *)local_d0.space;
    goto LAB_00106f0e;
  }
  if ((local_38 == 0) && (local_60->backrefs == 0)) {
    pcVar23 = pcVar23 + 1;
  }
  else {
    while( true ) {
      if ((local_d0.eflags & 0x100U) != 0) {
        printf("=%s\n","finding start");
      }
      pcVar23 = lslow(&local_d0,local_d0.coldp,pcVar10,lVar25,sVar3);
      if (pcVar23 != (char *)0x0) break;
      if (local_d0.endp <= local_d0.coldp) {
        pcVar23 = "int lmatcher()";
        goto LAB_00107015;
      }
      local_d0.coldp = local_d0.coldp + 1;
    }
    if ((sVar4 != 1) || (prVar6->backrefs != 0)) {
      if (local_d0.pmatch == (regmatch_t *)0x0) {
        local_d0.pmatch = (regmatch_t *)malloc((local_d0.g)->nsub * 0x10 + 0x10);
      }
      __ptr = local_d0.pmatch;
      if (local_d0.pmatch == (regmatch_t *)0x0) {
        iVar7 = 0xc;
        __ptr_00 = (regmatch_t *)local_d0.space;
        goto LAB_00106f0e;
      }
      if ((local_d0.g)->nsub != 0) {
        memset(local_d0.pmatch + 1,0xff,(local_d0.g)->nsub << 4);
      }
      if ((prVar6->backrefs == 0) && (((uint)local_d0.eflags >> 10 & 1) == 0)) {
        if (((uint)local_d0.eflags >> 8 & 1) != 0) {
          printf("=%s\n","dissecting");
        }
        pcVar12 = ldissect(&local_d0,local_d0.coldp,pcVar23,lVar25,sVar3);
      }
      else {
        lVar24 = prVar6->nplus;
        if ((0 < lVar24) && ((regmatch_t *)local_d0.lastpos == (regmatch_t *)0x0)) {
          local_d0.lastpos = (char **)malloc(lVar24 * 8 + 8);
        }
        if ((0 < lVar24) && ((regmatch_t *)local_d0.lastpos == (regmatch_t *)0x0)) {
          iVar7 = 0xc;
          goto LAB_00106efe;
        }
        if ((local_d0.eflags & 0x100U) != 0) {
          printf("=%s\n","backref dissect");
        }
        pcVar12 = lbackref(&local_d0,local_d0.coldp,pcVar23,lVar25,sVar3,0);
      }
      if (pcVar12 == (char *)0x0) {
        if (prVar6->backrefs == 0) {
          pcVar23 = "int lmatcher()";
          goto LAB_001070ed;
        }
        if ((prVar6->nplus != 0) && ((regmatch_t *)local_d0.lastpos == (regmatch_t *)0x0)) {
          pcVar23 = "int lmatcher()";
          goto LAB_001070ce;
        }
        bVar26 = true;
        if (local_d0.coldp < pcVar23) {
          pcVar12 = (char *)0x0;
          while( true ) {
            if ((local_d0.eflags & 0x100U) != 0) {
              printf("=%s\n","backoff");
            }
            pcVar23 = lslow(&local_d0,local_d0.coldp,pcVar23 + -1,lVar25,sVar3);
            if (pcVar23 == (char *)0x0) break;
            sVar13 = (local_d0.g)->nsub;
            if (sVar13 != 0) {
              prVar14 = &local_d0.pmatch[1].rm_eo;
              do {
                if (((regmatch_t *)(prVar14 + -1))->rm_so != -1) {
                  pcVar23 = "int lmatcher()";
                  goto LAB_00106f6b;
                }
                if (*prVar14 != -1) {
                  pcVar23 = "int lmatcher()";
                  goto LAB_00106f8a;
                }
                prVar14 = prVar14 + 2;
                sVar13 = sVar13 - 1;
              } while (sVar13 != 0);
            }
            if ((local_d0.eflags & 0x100U) != 0) {
              printf("=%s\n","backoff dissect");
            }
            pcVar12 = lbackref(&local_d0,local_d0.coldp,pcVar23,lVar25,sVar3,0);
            bVar26 = pcVar12 == (char *)0x0;
            if ((!bVar26) || (pcVar23 <= local_d0.coldp)) goto LAB_001065ac;
          }
          pcVar23 = (char *)0x0;
        }
        else {
          pcVar12 = (char *)0x0;
        }
LAB_001065ac:
        if ((!bVar26) && (pcVar12 != pcVar23)) {
          pcVar23 = "int lmatcher()";
          goto LAB_0010710c;
        }
        if (bVar26) {
          if ((local_d0.eflags & 0x100U) != 0) {
            printf("=%s\n");
          }
          pcVar23 = local_d0.coldp + 1;
          if (pcVar10 < pcVar23) goto code_r0x001065f4;
          goto LAB_00105ed2;
        }
      }
    }
  }
  if (sVar4 != 0) {
    *local_50 = (regmatch_t)((long)local_d0.coldp - (long)local_d0.offp);
    local_50[1] = (regmatch_t)((long)pcVar23 - (long)local_d0.offp);
  }
  if (sVar4 < 2) goto LAB_00106ee2;
  if (local_d0.pmatch == (regmatch_t *)0x0) {
    pcVar23 = "int lmatcher()";
    goto LAB_00107142;
  }
  uVar16 = 1;
  lVar25 = 0x10;
  do {
    puVar18 = (undefined8 *)((long)&local_50->rm_so + lVar25);
    if ((local_d0.g)->nsub < uVar16) {
      *(undefined4 *)puVar18 = 0xffffffff;
      *(undefined4 *)((long)puVar18 + 4) = 0xffffffff;
      *(undefined4 *)(puVar18 + 1) = 0xffffffff;
      *(undefined4 *)((long)puVar18 + 0xc) = 0xffffffff;
    }
    else {
      puVar1 = (undefined8 *)((long)&(local_d0.pmatch)->rm_so + lVar25);
      uVar5 = puVar1[1];
      *puVar18 = *puVar1;
      puVar18[1] = uVar5;
    }
    uVar16 = uVar16 + 1;
    lVar25 = lVar25 + 0x10;
  } while (sVar4 != uVar16);
LAB_00106ee2:
  if (local_d0.pmatch != (regmatch_t *)0x0) {
    free(local_d0.pmatch);
  }
  iVar7 = 0;
  __ptr = (regmatch_t *)local_d0.lastpos;
  __ptr_00 = (regmatch_t *)local_d0.space;
  if ((regmatch_t *)local_d0.lastpos != (regmatch_t *)0x0) {
LAB_00106efe:
    free(__ptr);
    __ptr_00 = (regmatch_t *)local_d0.space;
  }
  goto LAB_00106f0e;
code_r0x001065f4:
  pcVar23 = "int lmatcher()";
  goto LAB_00106d77;
code_r0x00106d62:
  pcVar23 = "int smatcher()";
LAB_00106d77:
  __assert_fail("start <= stop",
                "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                ,0xdf,pcVar23);
LAB_00106a4f:
  if (local_58 == (char *)0x0) {
    pcVar23 = "char *sfast()";
LAB_001070af:
    __assert_fail("coldp != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                  ,0x2d0,pcVar23);
  }
  local_d0.coldp = local_58;
  if (((uint)local_48 & bef_00) == 0) {
    return 1;
  }
  if ((uVar16 == 0) && (local_60->backrefs == 0)) {
    pcVar23 = pcVar23 + 1;
  }
  else {
    while( true ) {
      if ((local_d0.eflags & 0x100U) != 0) {
        printf("=%s\n","finding start");
      }
      pcVar23 = sslow((smat *)&local_d0,local_d0.coldp,pcVar10,lVar25,sVar3);
      if (pcVar23 != (char *)0x0) break;
      if (local_d0.endp <= local_d0.coldp) {
        pcVar23 = "int smatcher()";
LAB_00107015:
        __assert_fail("m->coldp < m->endp",
                      "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                      ,0xa2,pcVar23);
      }
      local_d0.coldp = local_d0.coldp + 1;
    }
    if ((uVar16 != 1) || (prVar6->backrefs != 0)) {
      if (local_d0.pmatch == (regmatch_t *)0x0) {
        local_d0.pmatch = (regmatch_t *)malloc((local_d0.g)->nsub * 0x10 + 0x10);
      }
      __ptr_00 = local_d0.pmatch;
      if (local_d0.pmatch == (regmatch_t *)0x0) {
        return 0xc;
      }
      if ((local_d0.g)->nsub != 0) {
        memset(local_d0.pmatch + 1,0xff,(local_d0.g)->nsub << 4);
      }
      if ((prVar6->backrefs == 0) && (((uint)local_d0.eflags >> 10 & 1) == 0)) {
        if (((uint)local_d0.eflags >> 8 & 1) != 0) {
          printf("=%s\n","dissecting");
        }
        pcVar12 = sdissect((smat *)&local_d0,local_d0.coldp,pcVar23,lVar25,sVar3);
      }
      else {
        lVar24 = prVar6->nplus;
        if ((0 < lVar24) && ((regmatch_t *)local_d0.lastpos == (regmatch_t *)0x0)) {
          local_d0.lastpos = (char **)malloc(lVar24 * 8 + 8);
        }
        if ((0 < lVar24) && ((regmatch_t *)local_d0.lastpos == (regmatch_t *)0x0)) {
          iVar7 = 0xc;
          goto LAB_00106f0e;
        }
        if ((local_d0.eflags & 0x100U) != 0) {
          printf("=%s\n","backref dissect");
        }
        pcVar12 = sbackref((smat *)&local_d0,local_d0.coldp,pcVar23,lVar25,sVar3,0);
      }
      if (pcVar12 == (char *)0x0) {
        if (prVar6->backrefs == 0) {
          pcVar23 = "int smatcher()";
LAB_001070ed:
          __assert_fail("g->backrefs",
                        "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                        ,0xc5,pcVar23);
        }
        if ((prVar6->nplus != 0) && ((regmatch_t *)local_d0.lastpos == (regmatch_t *)0x0)) {
          pcVar23 = "int smatcher()";
LAB_001070ce:
          __assert_fail("g->nplus == 0 || m->lastpos != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                        ,0xc6,pcVar23);
        }
        bVar26 = true;
        if (local_d0.coldp < pcVar23) {
          pcVar12 = (char *)0x0;
          while( true ) {
            if ((local_d0.eflags & 0x100U) != 0) {
              printf("=%s\n","backoff");
            }
            pcVar23 = sslow((smat *)&local_d0,local_d0.coldp,pcVar23 + -1,lVar25,sVar3);
            if (pcVar23 == (char *)0x0) break;
            sVar13 = (local_d0.g)->nsub;
            if (sVar13 != 0) {
              prVar14 = &local_d0.pmatch[1].rm_eo;
              do {
                if (((regmatch_t *)(prVar14 + -1))->rm_so != -1) {
                  pcVar23 = "int smatcher()";
LAB_00106f6b:
                  __assert_fail("m->pmatch[i].rm_so == -1",
                                "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                                ,0xd1,pcVar23);
                }
                if (*prVar14 != -1) {
                  pcVar23 = "int smatcher()";
LAB_00106f8a:
                  __assert_fail("m->pmatch[i].rm_eo == -1",
                                "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                                ,0xd2,pcVar23);
                }
                prVar14 = prVar14 + 2;
                sVar13 = sVar13 - 1;
              } while (sVar13 != 0);
            }
            if ((local_d0.eflags & 0x100U) != 0) {
              printf("=%s\n","backoff dissect");
            }
            pcVar12 = sbackref((smat *)&local_d0,local_d0.coldp,pcVar23,lVar25,sVar3,0);
            bVar26 = pcVar12 == (char *)0x0;
            if ((!bVar26) || (pcVar23 <= local_d0.coldp)) goto LAB_00106d1a;
          }
          pcVar23 = (char *)0x0;
        }
        else {
          pcVar12 = (char *)0x0;
        }
LAB_00106d1a:
        if ((!bVar26) && (pcVar12 != pcVar23)) {
          pcVar23 = "int smatcher()";
LAB_0010710c:
          __assert_fail("dp == NULL || dp == endp",
                        "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                        ,0xd8,pcVar23);
        }
        if (bVar26) {
          if ((local_d0.eflags & 0x100U) != 0) {
            printf("=%s\n","false alarm");
          }
          pcVar23 = local_d0.coldp + 1;
          if (pcVar10 < pcVar23) goto code_r0x00106d62;
          goto LAB_00106711;
        }
      }
    }
  }
  if (uVar16 != 0) {
    *local_50 = (regmatch_t)((long)local_d0.coldp - (long)local_d0.offp);
    local_50[1] = (regmatch_t)((long)pcVar23 - (long)local_d0.offp);
  }
  if (1 < uVar16) {
    if (local_d0.pmatch == (regmatch_t *)0x0) {
      pcVar23 = "int smatcher()";
LAB_00107142:
      __assert_fail("m->pmatch != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                    ,0xe8,pcVar23);
    }
    uVar15 = 1;
    lVar25 = 0x10;
    do {
      puVar18 = (undefined8 *)((long)&local_50->rm_so + lVar25);
      if ((local_d0.g)->nsub < uVar15) {
        *(undefined4 *)puVar18 = 0xffffffff;
        *(undefined4 *)((long)puVar18 + 4) = 0xffffffff;
        *(undefined4 *)(puVar18 + 1) = 0xffffffff;
        *(undefined4 *)((long)puVar18 + 0xc) = 0xffffffff;
      }
      else {
        puVar1 = (undefined8 *)((long)&(local_d0.pmatch)->rm_so + lVar25);
        uVar5 = puVar1[1];
        *puVar18 = *puVar1;
        puVar18[1] = uVar5;
      }
      uVar15 = uVar15 + 1;
      lVar25 = lVar25 + 0x10;
    } while (uVar16 != uVar15);
  }
  if (local_d0.pmatch != (regmatch_t *)0x0) {
    free(local_d0.pmatch);
  }
  iVar7 = 0;
  __ptr_00 = (regmatch_t *)local_d0.lastpos;
  if ((regmatch_t *)local_d0.lastpos == (regmatch_t *)0x0) {
    return 0;
  }
LAB_00106f0e:
  free(__ptr_00);
  return iVar7;
}

Assistant:

int				/* 0 success, REG_NOMATCH failure */
regexec(preg, string, nmatch, pmatch, eflags)
const regex_t *preg;
const char *string;
size_t nmatch;
regmatch_t pmatch[];
int eflags;
{
	struct re_guts *g = preg->re_g;
#ifdef REDEBUG
#	define	GOODFLAGS(f)	(f)
#else
#	define	GOODFLAGS(f)	((f)&(REG_NOTBOL|REG_NOTEOL|REG_STARTEND))
#endif

	if (preg->re_magic != MAGIC1 || g->magic != MAGIC2)
		return(REG_BADPAT);
	assert(!(g->iflags&BAD));
	if (g->iflags&BAD)		/* backstop for no-debug case */
		return(REG_BADPAT);
	eflags = GOODFLAGS(eflags);

	if ((size_t) g->nstates <= CHAR_BIT*sizeof(states1) && !(eflags&REG_LARGE))
		return(smatcher(g, (char *)string, nmatch, pmatch, eflags));
	else
		return(lmatcher(g, (char *)string, nmatch, pmatch, eflags));
}